

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

bool __thiscall
nuraft::asio_rpc_client::handle_custom_resp_meta
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<resp_msg> *rsp,rpc_handler *when_done,
          string *meta_str)

{
  element_type *peVar1;
  bool bVar2;
  ptr<resp_msg> rsp_1;
  ptr<rpc_exception> except;
  shared_ptr<nuraft::resp_msg> local_b8;
  shared_ptr<nuraft::rpc_exception> local_a8;
  undefined1 local_98 [8];
  strfmt<100> local_90;
  
  peVar1 = (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_90.buf_._8_4_ = (peVar1->super_msg_base).dst_;
  local_90.buf_._40_8_ = peVar1->commit_idx_;
  local_90.buf_._16_8_ = (peVar1->super_msg_base).term_;
  local_90.buf_._0_8_ = *(undefined8 *)&(peVar1->super_msg_base).type_;
  local_90.buf_._24_8_ = peVar1->last_log_term_;
  local_90.buf_._32_8_ = peVar1->last_log_idx_;
  bVar2 = std::
          function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(&(this->impl_->my_opt_).read_resp_meta_,
                       (asio_service_meta_cb_params *)(local_98 + 8),meta_str);
  if (!bVar2) {
    local_b8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90.fmt_ = "response meta verification failed: from peer %d, %s:%s";
    local_98 = (undefined1  [8])
               strfmt<100>::fmt<int,char_const*,char_const*>
                         ((strfmt<100> *)(local_98 + 8),
                          (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->super_msg_base).dst_,(this->host_)._M_dataplus._M_p,
                          (this->port_)._M_dataplus._M_p);
    std::make_shared<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)&local_a8,(shared_ptr<nuraft::req_msg> *)local_98);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(when_done,&local_b8,&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a8.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return bVar2;
}

Assistant:

bool handle_custom_resp_meta(ptr<req_msg>& req,
                                 ptr<resp_msg>& rsp,
                                 rpc_handler& when_done,
                                 const std::string& meta_str)
    {
        bool meta_ok = impl_->get_options().read_resp_meta_
                       ( req_to_params(req), meta_str );

        if (!meta_ok) {
            // Callback function returns false, should return failure.
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "response meta verification failed: "
                             "from peer %d, %s:%s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
            return false;
        }
        return true;
    }